

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_crld.cc
# Opt level: O1

int set_dist_point_name(DIST_POINT_NAME **pdp,X509V3_CTX *ctx,CONF_VALUE *cnf)

{
  char *__s1;
  int iVar1;
  int iVar2;
  stack_st_CONF_VALUE *dn_sk;
  X509_NAME *nm;
  size_t sVar3;
  void *pvVar4;
  OPENSSL_STACK *pOVar5;
  DIST_POINT_NAME *pDVar6;
  OPENSSL_STACK *sk;
  OPENSSL_STACK *sk_00;
  
  __s1 = cnf->name;
  iVar1 = strncmp(__s1,"fullname",9);
  if (iVar1 == 0) {
    if (cnf->value == (char *)0x0) {
      iVar1 = 100;
      goto LAB_00324d77;
    }
    pOVar5 = (OPENSSL_STACK *)gnames_from_sectname(ctx,cnf->value);
    sk_00 = (OPENSSL_STACK *)0x0;
    sk = (OPENSSL_STACK *)0x0;
    if (pOVar5 == (OPENSSL_STACK *)0x0) goto LAB_00324e16;
  }
  else {
    iVar1 = strcmp(__s1,"relativename");
    if (iVar1 != 0) {
      return 0;
    }
    if (cnf->value == (char *)0x0) {
      iVar1 = 0x6f;
LAB_00324d77:
      ERR_put_error(0x14,0,0x89,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_crld.cc"
                    ,iVar1);
      return -1;
    }
    dn_sk = X509V3_get_section((X509V3_CTX *)ctx,cnf->value);
    if (dn_sk == (stack_st_CONF_VALUE *)0x0) {
      sk_00 = (OPENSSL_STACK *)0x0;
      ERR_put_error(0x14,0,0x99,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_crld.cc"
                    ,0x74);
      iVar1 = 1;
    }
    else {
      nm = X509_NAME_new();
      if (nm == (X509_NAME *)0x0) {
        iVar1 = 1;
        sk_00 = (OPENSSL_STACK *)0x0;
      }
      else {
        iVar2 = X509V3_NAME_from_section(nm,dn_sk,0x1001);
        sk_00 = (OPENSSL_STACK *)nm->entries;
        nm->entries = (stack_st_X509_NAME_ENTRY *)0x0;
        X509_NAME_free(nm);
        iVar1 = 2;
        if ((iVar2 != 0) && (sVar3 = OPENSSL_sk_num(sk_00), sVar3 != 0)) {
          sVar3 = OPENSSL_sk_num(sk_00);
          pvVar4 = OPENSSL_sk_value(sk_00,sVar3 - 1);
          if (*(int *)((long)pvVar4 + 0x10) == 0) {
            iVar1 = 0;
          }
          else {
            ERR_put_error(0x14,0,0x7a,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_crld.cc"
                          ,0x84);
          }
        }
      }
    }
    if (iVar1 == 2) {
      sk = (OPENSSL_STACK *)0x0;
      goto LAB_00324e16;
    }
    pOVar5 = (OPENSSL_STACK *)0x0;
    if (iVar1 != 0) {
      return -1;
    }
  }
  sk = pOVar5;
  if (*pdp == (DIST_POINT_NAME *)0x0) {
    pDVar6 = (DIST_POINT_NAME *)ASN1_item_new((ASN1_ITEM *)&DIST_POINT_NAME_it);
    *pdp = pDVar6;
    if (pDVar6 != (DIST_POINT_NAME *)0x0) {
      if (sk == (OPENSSL_STACK *)0x0) {
        pDVar6->type = 1;
        (pDVar6->name).fullname = (GENERAL_NAMES *)sk_00;
      }
      else {
        pDVar6->type = 0;
        (pDVar6->name).fullname = (GENERAL_NAMES *)sk;
      }
      return 1;
    }
  }
  else {
    ERR_put_error(0x14,0,0x6a,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_crld.cc"
                  ,0x8c);
  }
LAB_00324e16:
  OPENSSL_sk_pop_free_ex(sk,sk_GENERAL_NAME_call_free_func,GENERAL_NAME_free);
  OPENSSL_sk_pop_free_ex(sk_00,sk_X509_NAME_ENTRY_call_free_func,X509_NAME_ENTRY_free);
  return -1;
}

Assistant:

static int set_dist_point_name(DIST_POINT_NAME **pdp, const X509V3_CTX *ctx,
                               const CONF_VALUE *cnf) {
  STACK_OF(GENERAL_NAME) *fnm = NULL;
  STACK_OF(X509_NAME_ENTRY) *rnm = NULL;
  if (!strncmp(cnf->name, "fullname", 9)) {
    // If |cnf| comes from |X509V3_parse_list|, which is possible for a v2i
    // function, |cnf->value| may be NULL.
    if (cnf->value == NULL) {
      OPENSSL_PUT_ERROR(X509V3, X509V3_R_MISSING_VALUE);
      return -1;
    }
    fnm = gnames_from_sectname(ctx, cnf->value);
    if (!fnm) {
      goto err;
    }
  } else if (!strcmp(cnf->name, "relativename")) {
    // If |cnf| comes from |X509V3_parse_list|, which is possible for a v2i
    // function, |cnf->value| may be NULL.
    if (cnf->value == NULL) {
      OPENSSL_PUT_ERROR(X509V3, X509V3_R_MISSING_VALUE);
      return -1;
    }
    const STACK_OF(CONF_VALUE) *dnsect = X509V3_get_section(ctx, cnf->value);
    if (!dnsect) {
      OPENSSL_PUT_ERROR(X509V3, X509V3_R_SECTION_NOT_FOUND);
      return -1;
    }
    X509_NAME *nm = X509_NAME_new();
    if (!nm) {
      return -1;
    }
    int ret = X509V3_NAME_from_section(nm, dnsect, MBSTRING_ASC);
    rnm = nm->entries;
    nm->entries = NULL;
    X509_NAME_free(nm);
    if (!ret || sk_X509_NAME_ENTRY_num(rnm) <= 0) {
      goto err;
    }
    // There can only be one RDN in nameRelativeToCRLIssuer.
    if (sk_X509_NAME_ENTRY_value(rnm, sk_X509_NAME_ENTRY_num(rnm) - 1)->set) {
      OPENSSL_PUT_ERROR(X509V3, X509V3_R_INVALID_MULTIPLE_RDNS);
      goto err;
    }
  } else {
    return 0;
  }

  if (*pdp) {
    OPENSSL_PUT_ERROR(X509V3, X509V3_R_DISTPOINT_ALREADY_SET);
    goto err;
  }

  *pdp = DIST_POINT_NAME_new();
  if (!*pdp) {
    goto err;
  }
  if (fnm) {
    (*pdp)->type = 0;
    (*pdp)->name.fullname = fnm;
  } else {
    (*pdp)->type = 1;
    (*pdp)->name.relativename = rnm;
  }

  return 1;

err:
  sk_GENERAL_NAME_pop_free(fnm, GENERAL_NAME_free);
  sk_X509_NAME_ENTRY_pop_free(rnm, X509_NAME_ENTRY_free);
  return -1;
}